

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O2

void __thiscall
QCompleterItemDelegate::paint
          (QCompleterItemDelegate *this,QPainter *p,QStyleOptionViewItem *opt,QModelIndex *idx)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStyleOptionViewItem optCopy;
  QModelIndex QStack_118;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_100,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_100,opt);
  local_100.showDecorationSelected = true;
  QAbstractItemView::currentIndex(&QStack_118,(QAbstractItemView *)this->view);
  bVar1 = ::comparesEqual(&QStack_118,idx);
  if (bVar1) {
    local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 1;
  }
  QStyledItemDelegate::paint((QStyledItemDelegate *)this,p,&local_100,idx);
  QStyleOptionViewItem::~QStyleOptionViewItem(&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paint(QPainter *p, const QStyleOptionViewItem& opt, const QModelIndex& idx) const override {
        QStyleOptionViewItem optCopy = opt;
        optCopy.showDecorationSelected = true;
        if (view->currentIndex() == idx)
            optCopy.state |= QStyle::State_HasFocus;
        QStyledItemDelegate::paint(p, optCopy, idx);
    }